

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_udp_sockets.hpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_udp_socket::session_udp_socket
          (session_udp_socket *this,io_context *ios,listen_socket_handle *ls)

{
  _Atomic_word *p_Var1;
  int iVar2;
  listen_socket_handle local_18;
  
  local_18.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (ls->m_sock).
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_18.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (ls->m_sock).super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (ls->m_sock).super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (ls->m_sock).super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  udp_socket::udp_socket(&this->sock,ios,&local_18);
  if (local_18.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_18.m_sock.
                 super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_18.m_sock.
               super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_18.m_sock.
       super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_18.m_sock.
         super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  this->write_blocked = false;
  return;
}

Assistant:

explicit session_udp_socket(io_context& ios, listen_socket_handle ls)
			: sock(ios, std::move(ls)) {}